

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O2

void __thiscall
test_matrix_dense_matrix_matrix_subtraction_Test::~test_matrix_dense_matrix_matrix_subtraction_Test
          (test_matrix_dense_matrix_matrix_subtraction_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_dense, matrix_matrix_subtraction) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_1 = {{4, 3}, {2, 1}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_0 = {{10, 20}, {30, 40}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_1 = {{40, 30}, {20, 10}};

  Matrix_Dense<Scalar, 0, 0> result_dynamic = dynamic_matrix_0 - dynamic_matrix_1;
  Matrix_Dense<Scalar, 2, 2> result_static_0 = static_matrix_0 - static_matrix_1;
  EXPECT_DOUBLE_EQ(result_dynamic[0][0], -3);
  EXPECT_DOUBLE_EQ(result_dynamic[0][1], -1);
  EXPECT_DOUBLE_EQ(result_dynamic[1][0], 1);
  EXPECT_DOUBLE_EQ(result_dynamic[1][1], 3);
  EXPECT_DOUBLE_EQ(result_static_0[0][0], -30);
  EXPECT_DOUBLE_EQ(result_static_0[0][1], -10);
  EXPECT_DOUBLE_EQ(result_static_0[1][0], 10);
  EXPECT_DOUBLE_EQ(result_static_0[1][1], 30);

  result_static_0 = dynamic_matrix_1 - static_matrix_0;
  Matrix_Dense<Scalar, 2, 2> result_static_1 = static_matrix_1 - dynamic_matrix_0;
  EXPECT_DOUBLE_EQ(result_static_0[0][0], -6);
  EXPECT_DOUBLE_EQ(result_static_0[0][1], -17);
  EXPECT_DOUBLE_EQ(result_static_0[1][0], -28);
  EXPECT_DOUBLE_EQ(result_static_0[1][1], -39);
  EXPECT_DOUBLE_EQ(result_static_1[0][0], 39);
  EXPECT_DOUBLE_EQ(result_static_1[0][1], 28);
  EXPECT_DOUBLE_EQ(result_static_1[1][0], 17);
  EXPECT_DOUBLE_EQ(result_static_1[1][1], 6);

  Matrix_Dense<Scalar, 0, 0> dynamic_incorrect;
  Matrix_Dense<Scalar, 2, 3> static_incorrect;
  EXPECT_DEATH(dynamic_matrix_0 - dynamic_incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_0 - static_incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_0 - dynamic_incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_0 - static_incorrect, "./*");
}